

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

ParamType * testing::WithParamInterface<bssl::(anonymous_namespace)::VersionParam>::GetParam(void)

{
  bool bVar1;
  ostream *poVar2;
  GTestLog local_c;
  
  bVar1 = internal::IsTrue(parameter_ != (ParamType *)0x0);
  if (!bVar1) {
    internal::GTestLog::GTestLog
              (&local_c,GTEST_FATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/gtest.h"
               ,0x6a1);
    poVar2 = std::operator<<((ostream *)&std::cerr,"Condition parameter_ != nullptr failed. ");
    poVar2 = std::operator<<(poVar2,
                             "GetParam() can only be called inside a value-parameterized test ");
    std::operator<<(poVar2,"-- did you intend to write TEST_P instead of TEST_F?");
    internal::GTestLog::~GTestLog(&local_c);
  }
  return parameter_;
}

Assistant:

static const ParamType& GetParam() {
    GTEST_CHECK_(parameter_ != nullptr)
        << "GetParam() can only be called inside a value-parameterized test "
        << "-- did you intend to write TEST_P instead of TEST_F?";
    return *parameter_;
  }